

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_writer.cc
# Opt level: O0

void __thiscall
NanomsgWriter::NanomsgWriter
          (NanomsgWriter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *endpoints)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  runtime_error *prVar4;
  undefined8 in_RSI;
  PacketWriter *in_RDI;
  stringstream ss_2;
  int rv;
  int size;
  stringstream ss_1;
  int rv_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *endpoint;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  stringstream ss;
  int fd;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa10;
  char *in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa20;
  size_t in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  undefined8 in_stack_fffffffffffffa38;
  undefined8 in_stack_fffffffffffffa40;
  string local_560 [32];
  stringstream local_540 [16];
  ostream local_530 [380];
  int local_3b4;
  undefined4 local_3b0;
  undefined1 local_3a9;
  string local_3a8 [32];
  stringstream local_388 [16];
  ostream local_378 [380];
  int local_1fc;
  reference local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d1;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [396];
  int local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  PacketWriter::PacketWriter(in_RDI);
  in_RDI->_vptr_PacketWriter = (_func_int **)&PTR__NanomsgWriter_001685d8;
  local_14 = nn_socket((int)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c);
  if (local_14 < 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<(local_1a0,"nn_socket: ");
    nn_errno();
    pcVar3 = nn_strerror(0);
    std::operator<<(poVar2,pcVar3);
    local_1d1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1d0);
    local_1d1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1e0 = local_10;
  local_1e8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffa10,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    if (!bVar1) break;
    local_1f8 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1e8);
    std::__cxx11::string::c_str();
    local_1fc = nn_bind(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    if (local_1fc < 0) {
      nn_close(in_stack_fffffffffffffa20);
      std::__cxx11::stringstream::stringstream(local_388);
      poVar2 = std::operator<<(local_378,"nn_bind: ");
      nn_errno();
      pcVar3 = nn_strerror(0);
      std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(local_378," (");
      poVar2 = std::operator<<(poVar2,(string *)local_1f8);
      std::operator<<(poVar2,")");
      local_3a9 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar4,local_3a8);
      local_3a9 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1e8);
  }
  local_3b0 = 0x100000;
  local_3b4 = nn_setsockopt((int)in_stack_fffffffffffffa40,
                            (int)((ulong)in_stack_fffffffffffffa38 >> 0x20),
                            (int)in_stack_fffffffffffffa38,
                            (void *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                            in_stack_fffffffffffffa28);
  if (local_3b4 < 0) {
    nn_close(in_stack_fffffffffffffa20);
    std::__cxx11::stringstream::stringstream(local_540);
    poVar2 = std::operator<<(local_530,"nn_setsockopt: ");
    nn_errno();
    pcVar3 = nn_strerror(0);
    std::operator<<(poVar2,pcVar3);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_560);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(int *)&in_RDI[1]._vptr_PacketWriter = local_14;
  return;
}

Assistant:

NanomsgWriter::NanomsgWriter(const std::vector<std::string>& endpoints) {
  auto fd = nn_socket(AF_SP, NN_PUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  for (const auto& endpoint : endpoints) {
    auto rv = nn_bind(fd, endpoint.c_str());
    if (rv < 0) {
      nn_close(fd);
      std::stringstream ss;
      ss << "nn_bind: " << nn_strerror(nn_errno());
      ss << " (" << endpoint << ")";
      throw std::runtime_error(ss.str());
    }
  }

  int size = 1048576;
  auto rv = nn_setsockopt(fd_, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
  if (rv < 0) {
    nn_close(fd_);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  fd_ = fd;
}